

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  ScopedElement e;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string local_38;
  
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase).m_sectionStack);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_40 + 8),"OverallResults",&local_41);
    XmlWriter::scopedElement((XmlWriter *)local_40,(string *)&this->m_xml);
    std::__cxx11::string::~string((string *)(local_40 + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_40 + 8),"successes",&local_41);
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_40,(string *)(local_40 + 8),&(sectionStats->assertions).passed);
    std::__cxx11::string::~string((string *)(local_40 + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_40 + 8),"failures",&local_41);
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_40,(string *)(local_40 + 8),&(sectionStats->assertions).failed);
    std::__cxx11::string::~string((string *)(local_40 + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_40 + 8),"expectedFailures",&local_41);
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_40,(string *)(local_40 + 8),
               &(sectionStats->assertions).failedButOk);
    std::__cxx11::string::~string((string *)(local_40 + 8));
    iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
              _vptr_NonCopyable[0xc])();
    if (iVar1 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_40 + 8),"durationInSeconds",&local_41);
      XmlWriter::writeAttribute<double>
                ((XmlWriter *)local_40,(string *)(local_40 + 8),&sectionStats->durationInSeconds);
      std::__cxx11::string::~string((string *)(local_40 + 8));
    }
    XmlWriter::endElement(&this->m_xml);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_40);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& sectionStats ) CATCH_OVERRIDE {
            StreamingReporterBase::sectionEnded( sectionStats );
            if( --m_sectionDepth > 0 ) {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes", sectionStats.assertions.passed );
                e.writeAttribute( "failures", sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

                m_xml.endElement();
            }
        }